

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaQNameRefPtr
xmlSchemaNewQNameRef
          (xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypeType refType,xmlChar *refName,xmlChar *refNs)

{
  xmlSchemaQNameRefPtr ret;
  xmlChar *refNs_local;
  xmlChar *refName_local;
  xmlSchemaTypeType refType_local;
  xmlSchemaParserCtxtPtr pctxt_local;
  
  pctxt_local = (xmlSchemaParserCtxtPtr)(*xmlMalloc)(0x30);
  if (pctxt_local == (xmlSchemaParserCtxtPtr)0x0) {
    xmlSchemaPErrMemory(pctxt,"allocating QName reference item",(xmlNodePtr)0x0);
    pctxt_local = (xmlSchemaParserCtxtPtr)0x0;
  }
  else {
    pctxt_local->serror = (xmlStructuredErrorFunc)0x0;
    pctxt_local->type = 2000;
    pctxt_local->warning = (xmlSchemaValidityWarningFunc)refName;
    *(xmlChar **)&pctxt_local->err = refNs;
    pctxt_local->errCtxt = (void *)0x0;
    *(xmlSchemaTypeType *)&pctxt_local->error = refType;
    xmlSchemaAddItemSize(&pctxt->constructor->bucket->locals,10,pctxt_local);
  }
  return (xmlSchemaQNameRefPtr)pctxt_local;
}

Assistant:

static xmlSchemaQNameRefPtr
xmlSchemaNewQNameRef(xmlSchemaParserCtxtPtr pctxt,
		     xmlSchemaTypeType refType,
		     const xmlChar *refName,
		     const xmlChar *refNs)
{
    xmlSchemaQNameRefPtr ret;

    ret = (xmlSchemaQNameRefPtr)
	xmlMalloc(sizeof(xmlSchemaQNameRef));
    if (ret == NULL) {
	xmlSchemaPErrMemory(pctxt,
	    "allocating QName reference item", NULL);
	return (NULL);
    }
    ret->node = NULL;
    ret->type = XML_SCHEMA_EXTRA_QNAMEREF;
    ret->name = refName;
    ret->targetNamespace = refNs;
    ret->item = NULL;
    ret->itemType = refType;
    /*
    * Store the reference item in the schema.
    */
    WXS_ADD_LOCAL(pctxt, ret);
    return (ret);
}